

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CGL::GLScene::Mesh::draw_vertex(Mesh *this,Vertex *v)

{
  long lVar1;
  
  lVar1 = 0xb0;
  if ((Vertex *)(this->selectedFeature).element != v) {
    lVar1 = (ulong)((Vertex *)(this->hoveredFeature).element == v) * 8 + 0xa0;
  }
  DrawStyle::style_vertex
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar1));
  glBegin(0);
  glVertex3d((v->position).field_0.field_0.x,(v->position).field_0.field_0.y,
             (v->position).field_0.field_0.z);
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_vertex(const Vertex *v) const {
  get_draw_style(v)->style_vertex();
  glBegin(GL_POINTS);
  glVertex3d(v->position.x, v->position.y, v->position.z);
  glEnd();
  get_draw_style(v)->style_reset();
}